

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O1

void __thiscall SynthWidget::handleMIDISessionAdded(SynthWidget *this,MidiSession *midiSession)

{
  QListWidget *pQVar1;
  uint uVar2;
  QListWidgetItem *this_00;
  anon_union_24_3_e3d07ef4_for_data local_40;
  MidiSession *local_20;
  
  this_00 = (QListWidgetItem *)operator_new(0x28);
  MidiSession::getName(midiSession);
  QListWidgetItem::QListWidgetItem
            (this_00,(QString *)local_40.data,(this->ui->super_Ui_SynthWidget).midiList,0);
  if ((QArrayData *)local_40.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_40.shared = *(int *)local_40.shared + -1;
    UNLOCK();
    if (*(int *)local_40.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_40.shared,2,8);
    }
  }
  local_20 = midiSession;
  QVariant::QVariant((QVariant *)&local_40,(QMetaType)0x1d0b58,&local_20);
  (**(code **)(*(long *)this_00 + 0x20))(this_00,0x100,&local_40);
  QVariant::~QVariant((QVariant *)&local_40);
  pQVar1 = (this->ui->super_Ui_SynthWidget).midiList;
  uVar2 = QListWidget::count();
  QListWidget::insertItem((int)pQVar1,(QListWidgetItem *)(ulong)uVar2);
  updateMidiAddActionEnabled(this->ui);
  return;
}

Assistant:

void SynthWidget::handleMIDISessionAdded(MidiSession *midiSession) {
	QListWidgetItem *item = new QListWidgetItem(midiSession->getName(), ui->midiList);
	item->setData(Qt::UserRole, QVariant::fromValue((QObject *)midiSession));
	ui->midiList->addItem(item);
	updateMidiAddActionEnabled(ui);
}